

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O2

ZyanStatus
ZydisEncoderEncodeInstructionInternal
          (ZydisEncoderRequest *request,void *buffer,ZyanUSize *length,
          ZydisEncoderInstruction *instruction)

{
  ZydisEncodableInstruction *pZVar1;
  ZydisOperandDefinition *def_op;
  ZydisMachineMode ZVar2;
  ZydisRegister ZVar3;
  ZydisOperandType ZVar4;
  ZydisRoundingMode ZVar5;
  ZydisSwizzleMode ZVar6;
  ZydisInstructionEncoding ZVar7;
  uint6 uVar8;
  uint3 uVar9;
  undefined2 uVar10;
  ZydisEncodableInstruction *pZVar11;
  ZydisEncoderInstruction *pZVar12;
  ZydisEncoderRequest *pZVar13;
  ZydisInstructionDefinition *pZVar14;
  ZydisOperandDefinition *pZVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  ZyanU8 ZVar20;
  byte bVar21;
  ZyanBool ZVar22;
  byte bVar23;
  byte bVar24;
  ZyanI8 ZVar25;
  ZyanI8 ZVar26;
  ZyanU8 ZVar27;
  ZydisRegisterWidth ZVar28;
  ZydisConversionMode ZVar29;
  ZydisBroadcastMode ZVar30;
  ZydisRegisterClass ZVar31;
  uint uVar32;
  ZyanStatus ZVar33;
  undefined3 *puVar34;
  undefined1 *puVar35;
  byte *pbVar36;
  ZydisInstructionAttributes ZVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 uVar40;
  ZyanU8 ZVar41;
  ZydisBroadcastMode ZVar42;
  int iVar43;
  ZydisRegister ZVar44;
  undefined3 *puVar45;
  byte bVar46;
  char cVar47;
  ushort uVar48;
  ushort uVar49;
  undefined6 *puVar50;
  byte bVar51;
  ushort uVar52;
  long lVar53;
  ZydisEncoderInstruction *pZVar54;
  ZydisEncoderOperand *pZVar55;
  uint uVar56;
  uint uVar57;
  ZydisRegister ZVar58;
  ZydisInstructionDefinitionMVEX *mvex_def;
  long lVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  ulong uStack_140;
  ZyanU8 pp;
  ZydisEncoderOperand *local_128;
  ZyanU8 vvvv;
  long local_118;
  ZydisEncodableInstruction *definition;
  ulong local_108;
  ulong local_100;
  ZydisEncoderInstruction *local_f8;
  byte local_e9;
  ulong local_e8;
  ulong local_e0;
  byte local_d1;
  ZydisEncoderInstructionMatch match;
  byte local_88;
  ZyanU8 mmmmm;
  ZydisInstructionDefinition *local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong *local_58;
  ulong local_50;
  ZydisEncodableInstruction *local_48;
  ulong local_40;
  ZydisEncoderOperand *local_38;
  
  match.eosz = '\0';
  match.easz = '\0';
  match.disp_size = '\0';
  match.imm_size = '\0';
  match.cd8_scale = '\0';
  match._45_3_ = 0;
  match.rex_type = ZYDIS_REX_TYPE_UNKNOWN;
  match.eosz64_forbidden = '\0';
  match.has_rel_operand = '\0';
  match._54_2_ = 0;
  match.operands = (ZydisOperandDefinition *)0x0;
  match.definition = (ZydisEncodableInstruction *)0x0;
  match.base_definition = (ZydisInstructionDefinition *)0x0;
  match.attributes = request->prefixes;
  definition = (ZydisEncodableInstruction *)0x0;
  local_f8 = instruction;
  match.request = request;
  local_58 = length;
  bVar17 = ZydisGetEncodableInstructions(request->mnemonic,&definition);
  if ((definition == (ZydisEncodableInstruction *)0x0) || (bVar17 == 0)) {
    __assert_fail("definition && definition_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0xb94,
                  "ZyanStatus ZydisFindMatchingDefinition(const ZydisEncoderRequest *, ZydisEncoderInstructionMatch *)"
                 );
  }
  local_48 = (ZydisEncodableInstruction *)buffer;
  bVar18 = ZydisGetMachineModeWidth(request->machine_mode);
  ZVar2 = request->machine_mode;
  bVar19 = ZydisGetAszFromHint(request->address_size_hint);
  if (4 < (ulong)request->operand_size_hint) {
    __assert_fail("(ZyanUSize)hint <= ZYDIS_OPERAND_SIZE_HINT_MAX_VALUE",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x145,"ZyanU8 ZydisGetOszFromHint(ZydisOperandSizeHint)");
  }
  bVar46 = bVar18 >> 4;
  local_5c = ZVar2 - ZYDIS_MACHINE_MODE_LEGACY_32;
  uVar56 = (uint)request->operand_count;
  local_38 = request->operands;
  bVar51 = 3;
  for (lVar53 = 0; (ulong)request->operand_count * 0x40 != lVar53; lVar53 = lVar53 + 0x40) {
    uVar56 = uVar56 | *(int *)((long)&request->operands[0].type + lVar53) + -1 << (bVar51 & 0x1f);
    bVar51 = bVar51 + 2;
  }
  local_68 = (bVar46 != 2) + 1;
  bVar51 = 0;
  local_60 = (uint)bVar19;
  local_64 = (uint)*(byte *)((long)&ZydisGetOszFromHint_lookup + (ulong)request->operand_size_hint);
  local_50 = 0x80000000000;
  local_40 = 0x200000000;
  do {
    if (bVar17 <= bVar51) {
      return 0x8020000c;
    }
    if (definition->operand_mask != (ZyanU16)uVar56) goto LAB_00114d11;
    _mmmmm = (ZydisInstructionDefinition *)0x0;
    ZydisGetInstructionDefinition
              (*(ushort *)&definition->field_0x6 &
               (ZYDIS_INSTRUCTION_ENCODING_EVEX|ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS),
               definition->instruction_reference,(ZydisInstructionDefinition **)&mmmmm);
    uVar16 = match._40_8_;
    uVar48 = *(ushort *)&definition->field_0x6;
    uVar57 = (uint)bVar46;
    if ((uVar48 >> 7 & uVar57 & 7) == 0) goto LAB_00114d11;
    if (request->allowed_encodings != ZYDIS_ENCODABLE_ENCODING_DEFAULT) {
      if (5 < (ushort)(uVar48 & 7)) {
        __assert_fail("(ZyanUSize)encoding <= ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0x114,
                      "ZydisEncodableEncoding ZydisGetEncodableEncoding(ZydisInstructionEncoding)");
      }
      if ((*(ZydisEncodableEncoding *)
            (ZydisGetEncodableEncoding_encoding_lookup + (ulong)(uVar48 & 7) * 4) &
          request->allowed_encodings) == ZYDIS_ENCODABLE_ENCODING_DEFAULT) goto LAB_00114d11;
    }
    if (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
      if (request->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
        if (((_mmmmm->field_0x5 & 0x20) == 0) && (3 < (ushort)((uVar48 & 6) - 2)))
        goto LAB_00114b14;
      }
      else if ((uVar48 & 7) != 5) goto LAB_00114b14;
      goto LAB_00114d11;
    }
LAB_00114b14:
    if ((*(ulong *)_mmmmm >> 0x2e & 1) != 0 && 0xfffffffd < local_5c) goto LAB_00114d11;
    if (((request->branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
        (request->branch_type != (*(uint *)&_mmmmm->field_0x8 >> 5 & ZYDIS_BRANCH_TYPE_FAR))) ||
       (((*(uint *)&_mmmmm->field_0x8 & 0x60) == 0 &&
        (request->branch_width != ZYDIS_BRANCH_WIDTH_NONE)))) goto LAB_00114d11;
    match.definition = definition;
    match.base_definition = _mmmmm;
    match.operands = (ZydisOperandDefinition *)0x0;
    uVar40 = 0;
    if ((definition->field_0x8 & 0x60) == 0x20) {
      uVar40 = (char)local_60;
    }
    cVar47 = '\0';
    if ((definition->field_0x8 & 0x60) == 0x40) {
      cVar47 = (char)local_64;
    }
    match._40_4_ = CONCAT22(0,CONCAT11(uVar40,cVar47));
    match._40_8_ = CONCAT44(SUB84(uVar16,4),match._40_4_) & 0xffffff00ffffffff;
    match._48_8_ = match._48_8_ & 0xffff000000000000;
    if (((*(ulong *)_mmmmm & 0xe00000000) != 0x200000000) && (cVar47 == '\b')) goto LAB_00114d11;
    if ((match.attributes & 0x7fff8000000) == 0) goto LAB_00114c5a;
    if ((*(uint *)&_mmmmm->field_0x8 >> 0x1d & 1) == 0 && (match.attributes & 0x7e000000000) != 0)
    goto LAB_00114d11;
    if ((definition->field_0x6 & 7) == 0) {
      uVar32 = (uint)match.attributes;
      if (((((((-1 < (int)*(uint *)&_mmmmm->field_0x8 & (byte)(match.attributes >> 0x1b) & 1) == 0)
             && ((uVar48 = *(ushort *)(_mmmmm + 1), (uVar32 >> 0x1c & 1) == 0 || ((uVar48 & 1) != 0)
                 ))) && (((uVar32 >> 0x1d & 1) == 0 || ((uVar48 & 2) != 0)))) &&
           (((((uVar32 >> 0x1e & 1) == 0 || ((uVar48 & 4) != 0)) &&
             ((-1 < (int)uVar32 || ((uVar48 & 8) != 0)))) &&
            (((match.attributes & 0x100000000) == 0 || ((uVar48 & 0x10) != 0)))))) &&
          (((local_40 & match.attributes) == 0 || ((uVar48 & 0x20) != 0)))) &&
         (((((match.attributes & 0xc00000000) == 0 || ((uVar48 & 0x100) != 0)) &&
           (((match.attributes >> 0x24 & 1) == 0 || ((uVar48 & 0x40) != 0)))) &&
          (((char)uVar48 < '\0' ||
           ((match.attributes & 0x300000000) == 0 || (uVar32 >> 0x1b & 1) != 0))))))
      goto LAB_00114c5a;
      goto LAB_00114d11;
    }
    if ((match.attributes & 0x1ff8000000) != 0) goto LAB_00114d11;
LAB_00114c5a:
    if (((uint)(*(ulong *)_mmmmm >> 0xf) & 7) != (uint)request->operand_count) {
      __assert_fail("request->operand_count == match->base_definition->operand_count_visible",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0xa75,
                    "ZyanBool ZydisIsDefinitionCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderRequest *)"
                   );
    }
    match.operands = ZydisGetOperandDefinitions(_mmmmm);
    uVar48 = *(ushort *)&(match.definition)->field_0x6 & 7;
    if (uVar48 == 5) {
      if (((match.definition)->modrm < 0xc0) || ((request->mvex).eviction_hint == '\0')) {
        switch(*(ushort *)(match.base_definition + 1) >> 6 & 0x1f) {
        case 0:
        case 1:
        case 4:
        case 5:
        case 6:
        case 7:
        case 0x13:
        case 0x15:
        case 0x17:
        case 0x19:
          if ((request->mvex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) {
            ZVar29 = (request->mvex).conversion;
            goto joined_r0x00114f11;
          }
          break;
        case 2:
          if ((request->mvex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) {
            ZVar5 = (request->mvex).conversion;
joined_r0x0011513e:
            if ((ZVar5 != ZYDIS_ROUNDING_MODE_INVALID) ||
               ((request->mvex).swizzle != ZYDIS_SWIZZLE_MODE_INVALID)) break;
            ZVar22 = (request->mvex).eviction_hint;
joined_r0x001151fc:
            if (ZVar22 == '\0') goto LAB_0011529a;
          }
          break;
        case 3:
          if (((request->mvex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) &&
             ((request->mvex).conversion == ZYDIS_CONVERSION_MODE_INVALID)) {
            ZVar5 = (request->mvex).rounding;
            goto joined_r0x0011513e;
          }
          break;
        case 8:
        case 9:
          if (((request->mvex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) &&
             ((request->mvex).conversion == ZYDIS_CONVERSION_MODE_INVALID)) {
            ZVar5 = (request->mvex).rounding;
            goto joined_r0x00114f00;
          }
          break;
        case 10:
          if (((((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID) &&
               ((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID)) &&
              ((request->mvex).sae == '\0')) &&
             (((ZVar30 = (request->mvex).broadcast, ZVar30 < ZYDIS_BROADCAST_MODE_8_TO_16 &&
               ((0x811U >> (ZVar30 & 0x1f) & 1) != 0)) &&
              ((ZVar29 = (request->mvex).conversion,
               ZVar29 < (ZYDIS_CONVERSION_MODE_SINT16|ZYDIS_CONVERSION_MODE_SINT8) &&
               (ZVar29 != ZYDIS_CONVERSION_MODE_SINT8)))))) {
LAB_001151af:
            if (ZVar29 == ZYDIS_CONVERSION_MODE_INVALID || ZVar30 == ZYDIS_BROADCAST_MODE_INVALID)
            goto LAB_0011529a;
          }
          break;
        case 0xb:
        case 0xf:
          if (((request->mvex).conversion == ZYDIS_CONVERSION_MODE_INVALID) &&
             ((((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID &&
               ((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID)) &&
              (((request->mvex).sae == '\0' && (ZVar29 = (request->mvex).broadcast, ZVar29 < 0xc))))
             )) {
            uVar32 = 0x811;
LAB_00115044:
            if ((uVar32 >> (ZVar29 & 0x1f) & 1) != 0) goto LAB_0011529a;
          }
          break;
        case 0xc:
        case 0x10:
          if (((((request->mvex).conversion == ZYDIS_CONVERSION_MODE_INVALID) &&
               ((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID)) &&
              ((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID)) &&
             (((request->mvex).sae == '\0' &&
              ((ZVar30 = (request->mvex).broadcast, ZVar30 == ZYDIS_BROADCAST_MODE_INVALID ||
               (ZVar30 == ZYDIS_BROADCAST_MODE_4_TO_16)))))) goto LAB_0011529a;
          break;
        case 0xd:
        case 0x11:
          if ((((request->mvex).conversion == ZYDIS_CONVERSION_MODE_INVALID) &&
              ((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID)) &&
             (((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID &&
              (((request->mvex).sae == '\0' && (ZVar29 = (request->mvex).broadcast, ZVar29 < 0xb))))
             )) {
            uVar32 = 0x409;
            goto LAB_00115044;
          }
          break;
        case 0xe:
          if ((((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID) &&
              ((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID)) &&
             (((request->mvex).sae == '\0' &&
              ((((ZVar30 = (request->mvex).broadcast, ZVar30 < ZYDIS_BROADCAST_MODE_8_TO_16 &&
                 ((0x811U >> (ZVar30 & 0x1f) & 1) != 0)) &&
                (ZVar29 = (request->mvex).conversion,
                ZVar29 < (ZYDIS_CONVERSION_MODE_SINT16|ZYDIS_CONVERSION_MODE_SINT8))) &&
               (ZVar29 != ZYDIS_CONVERSION_MODE_FLOAT16)))))) goto LAB_001151af;
          break;
        case 0x12:
        case 0x16:
          ZVar29 = (request->mvex).broadcast;
joined_r0x00114f11:
          if ((ZVar29 == ZYDIS_CONVERSION_MODE_INVALID) &&
             ((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID)) {
            ZVar5 = (request->mvex).swizzle;
joined_r0x00114f00:
            if (ZVar5 == ZYDIS_ROUNDING_MODE_INVALID) {
              ZVar22 = (request->mvex).sae;
              goto joined_r0x001151fc;
            }
          }
          break;
        case 0x14:
        case 0x18:
          if (((((request->mvex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) &&
               ((request->mvex).rounding == ZYDIS_ROUNDING_MODE_INVALID)) &&
              ((request->mvex).swizzle == ZYDIS_SWIZZLE_MODE_INVALID)) &&
             (((request->mvex).sae == '\0' &&
              (ZVar29 = (request->mvex).conversion,
              ZVar29 < (ZYDIS_CONVERSION_MODE_SINT16|ZYDIS_CONVERSION_MODE_SINT8))))) {
            uVar32 = 0x3d;
            goto LAB_00115044;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x9f7,
                        "ZyanBool ZydisAreMvexFeaturesCompatible(const ZydisEncoderInstructionMatch *, const ZydisEncoderRequest *)"
                       );
        }
      }
      goto LAB_00114d11;
    }
    if (uVar48 != 4) goto LAB_0011529a;
    uVar48 = *(ushort *)&match.base_definition[1].field_0x2;
    if (((uVar48 & 0x60) != 0x20 && (char)((uVar48 & 0x10) >> 4) == '\0') &&
       ((request->evex).zeroing_mask != '\0')) goto LAB_00114d11;
    switch(uVar48 & 3) {
    case 0:
      if ((request->evex).sae != '\0') goto LAB_00114d11;
      break;
    case 1:
      if (((request->evex).sae != '\0') || ((request->evex).rounding != ZYDIS_ROUNDING_MODE_INVALID)
         ) goto LAB_00114d11;
      ZVar30 = (request->evex).broadcast;
      if (ZVar30 != ZYDIS_BROADCAST_MODE_INVALID) {
        switch((byte)(match.definition)->field_0x8 >> 3 & 3) {
        case 0:
          __assert_fail("vector_length != ZYDIS_VECTOR_LENGTH_INVALID",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x88f,
                        "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                       );
        case 1:
          bVar19 = 0x10;
          break;
        case 2:
          bVar19 = 0x20;
          break;
        case 3:
          bVar19 = 0x40;
        }
        bVar21 = match.base_definition[1].field_0x1 & 0x1f;
        if (bVar21 != 1) {
          if (bVar21 == 0x10) {
            bVar19 = bVar19 >> 2;
          }
          else {
            if (bVar21 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x8a9,
                            "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                           );
            }
            bVar19 = bVar19 >> 1;
          }
        }
        bVar21 = ((byte)match.base_definition[1].field_0x1 >> 5) - 2;
        if (2 < bVar21) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x8b9,
                        "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                       );
        }
        bVar19 = bVar19 / (byte)(0x80402 >> ((bVar21 & 3) << 3));
        ZVar42 = ZYDIS_BROADCAST_MODE_1_TO_2;
        if (bVar19 != 2) {
          if (bVar19 == 0x20) {
            ZVar42 = ZYDIS_BROADCAST_MODE_1_TO_32;
          }
          else if (bVar19 == 8) {
            ZVar42 = ZYDIS_BROADCAST_MODE_1_TO_8;
          }
          else if (bVar19 == 0x10) {
            ZVar42 = ZYDIS_BROADCAST_MODE_1_TO_16;
          }
          else {
            if (bVar19 != 4) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x8d0,
                            "ZyanBool ZydisIsBroadcastModeCompatible(const ZydisInstructionDefinitionEVEX *, ZydisVectorLength, ZydisBroadcastMode)"
                           );
            }
            ZVar42 = ZYDIS_BROADCAST_MODE_1_TO_4;
          }
        }
        if (ZVar42 != ZVar30) goto LAB_00114d11;
      }
      goto LAB_0011529a;
    case 2:
      if ((request->evex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) {
        ZVar22 = (request->evex).sae;
        if ((request->evex).rounding == ZYDIS_ROUNDING_MODE_INVALID) goto joined_r0x001151fc;
        if (ZVar22 != '\0') goto LAB_0011529a;
      }
      goto LAB_00114d11;
    }
    if (((request->evex).broadcast != ZYDIS_BROADCAST_MODE_INVALID) ||
       ((request->evex).rounding != ZYDIS_ROUNDING_MODE_INVALID)) goto LAB_00114d11;
LAB_0011529a:
    lVar53 = 0;
    uVar38 = 0;
    pZVar55 = local_38;
    while (pZVar15 = match.operands, pZVar14 = match.base_definition, pZVar13 = match.request,
          uVar38 < request->operand_count) {
      uVar48 = *(ushort *)((long)(match.operands)->size + lVar53 + -2);
      local_e0 = uVar38;
      if ((~(uint)uVar48 & 0xc0) == 0) {
        __assert_fail("def_op->visibility != ZYDIS_OPERAND_VISIBILITY_HIDDEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa85,
                      "ZyanBool ZydisIsDefinitionCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderRequest *)"
                     );
      }
      if (3 < pZVar55->type - ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa96,
                      "ZyanBool ZydisIsDefinitionCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderRequest *)"
                     );
      }
      def_op = (ZydisOperandDefinition *)((long)(match.operands)->size + lVar53 + -2);
      local_128 = pZVar55;
      switch(pZVar55->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        local_118 = lVar53;
        ZVar31 = ZydisRegisterGetClass((pZVar55->reg).value);
        local_e8 = (ulong)ZVar31;
        ZVar28 = ZydisRegisterClassGetWidth((match.request)->machine_mode,ZVar31);
        pZVar55 = local_128;
        if (ZVar28 == 0) goto LAB_00114d11;
        switch(*(ushort *)def_op & 0x3f) {
        case 1:
          bVar19 = *(byte *)((long)pZVar15->size + local_118 + 7);
          bVar21 = bVar19 & 7;
          if (bVar21 == 2) {
            if (((ZydisRegisterClass)local_e8 - 5 < 0xfffffffc) ||
               (bVar19 = *(byte *)((long)pZVar15->size + local_118 + 8),
               bVar21 = ZydisRegisterGetId((local_128->reg).value), (bVar19 & 0x3f) != bVar21))
            goto LAB_00114d11;
            ZVar22 = ZydisCheckAsz(&match,ZVar28);
          }
          else {
            if (bVar21 != 1) {
              if ((bVar19 & 7) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x514,
                              "ZyanBool ZydisIsRegisterOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                             );
              }
              if ((local_128->reg).value ==
                  (*(ushort *)((long)pZVar15->size + local_118 + 8) &
                  (ZYDIS_REGISTER_BND0|ZYDIS_REGISTER_K7))) goto LAB_00115efb;
              goto LAB_00114d11;
            }
            if (((ZydisRegisterClass)local_e8 - 5 < 0xfffffffc) ||
               (bVar19 = *(byte *)((long)pZVar15->size + local_118 + 8),
               bVar21 = ZydisRegisterGetId((local_128->reg).value), (bVar19 & 0x3f) != bVar21))
            goto LAB_00114d11;
            ZVar22 = ZydisCheckOsz(&match,ZVar28);
          }
          if (ZVar22 != '\0') goto LAB_00116045;
          goto LAB_00114d11;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x612,
                        "ZyanBool ZydisIsRegisterOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                       );
        case 4:
          if (((ZydisRegisterClass)local_e8 == 1) &&
             (ZVar22 = ZydisIsRegisterAllowed(&match,(local_128->reg).value,ZYDIS_REGCLASS_GPR8),
             ZVar22 != '\0')) {
            ZVar44 = (pZVar55->reg).value;
            goto LAB_00116476;
          }
          goto LAB_00114d11;
        case 5:
          if ((ZydisRegisterClass)local_e8 == 2) {
            ZVar44 = (local_128->reg).value;
            ZVar31 = ZYDIS_REGCLASS_GPR16;
            goto LAB_00116030;
          }
          goto LAB_00114d11;
        case 6:
          if ((ZydisRegisterClass)local_e8 == 3) {
            ZVar44 = (local_128->reg).value;
            ZVar31 = ZYDIS_REGCLASS_GPR32;
            goto LAB_00116030;
          }
          goto LAB_00114d11;
        case 7:
          if ((ZydisRegisterClass)local_e8 == 4) goto LAB_00116045;
          goto LAB_00114d11;
        case 8:
          if ((0xfffffffc < (ZydisRegisterClass)local_e8 - 5) &&
             (ZVar22 = ZydisCheckOsz(&match,ZVar28), ZVar22 != '\0')) goto LAB_0011644f;
          goto LAB_00114d11;
        case 9:
          if ((ZydisRegisterClass)local_e8 - 5 < 0xfffffffe) goto LAB_00114d11;
          if (match.eosz == '\0') {
            if ((ZydisRegisterClass)local_e8 == 4) {
              match.eosz = '@';
            }
            else {
              match.eosz64_forbidden = '\x01';
            }
          }
          else if (match.eosz != (ZyanU8)ZVar28) goto LAB_00114d11;
LAB_0011644f:
          pZVar55 = local_128;
          ZVar22 = ZydisIsRegisterAllowed
                             (&match,(local_128->reg).value,(ZydisRegisterClass)local_e8);
          if (ZVar22 == '\0') goto LAB_00114d11;
          ZVar44 = (pZVar55->reg).value;
LAB_00116476:
          bVar60 = false;
          ZVar22 = ZydisValidateRexType(&match,ZVar44,'\0');
          if (ZVar22 == '\0') goto LAB_00114d11;
          break;
        case 10:
          if ((0xfffffffd < (ZydisRegisterClass)local_e8 - 4) &&
             ((ZVar22 = ZydisCheckOsz(&match,ZVar28), ZVar22 != '\0' ||
              (((ZydisRegisterClass)local_e8 == 3 && (match.eosz == '@')))))) {
            ZVar44 = (local_128->reg).value;
            goto LAB_00116009;
          }
          goto LAB_00114d11;
        case 0xb:
          if ((0xfffffffc < (ZydisRegisterClass)local_e8 - 5) &&
             (ZVar22 = ZydisCheckAsz(&match,ZVar28), ZVar22 != '\0')) {
            ZVar44 = (local_128->reg).value;
LAB_00116009:
            ZVar31 = (ZydisRegisterClass)local_e8;
            goto LAB_00116030;
          }
          goto LAB_00114d11;
        case 0xc:
          bVar60 = (ZydisRegisterClass)local_e8 == 5;
          goto LAB_00115f18;
        case 0xd:
          bVar60 = (ZydisRegisterClass)local_e8 == 6;
          goto LAB_00115f18;
        case 0xe:
          if ((ZydisRegisterClass)local_e8 == 7) {
            ZVar44 = (local_128->reg).value;
            ZVar31 = ZYDIS_REGCLASS_XMM;
            goto LAB_00115dd9;
          }
          goto LAB_00114d11;
        case 0xf:
          if ((ZydisRegisterClass)local_e8 != 8) goto LAB_00114d11;
          ZVar44 = (local_128->reg).value;
          ZVar31 = ZYDIS_REGCLASS_YMM;
LAB_00115dd9:
          ZVar22 = ZydisIsRegisterAllowed(&match,ZVar44,ZVar31);
          if (ZVar22 == '\0') goto LAB_00114d11;
          bVar60 = (*(byte *)((long)pZVar15->size + local_118 + 7) & 0x3f) == 5;
          pZVar55 = local_128;
          break;
        case 0x10:
          if ((ZydisRegisterClass)local_e8 != 9) goto LAB_00114d11;
          ZVar44 = (local_128->reg).value;
          ZVar31 = ZYDIS_REGCLASS_ZMM;
LAB_00116030:
          ZVar22 = ZydisIsRegisterAllowed(&match,ZVar44,ZVar31);
          if (ZVar22 == '\0') goto LAB_00114d11;
LAB_00116045:
          bVar60 = false;
          pZVar55 = local_128;
          break;
        case 0x11:
          bVar60 = (ZydisRegisterClass)local_e8 == 10;
          goto LAB_00115f18;
        case 0x12:
          bVar60 = (ZydisRegisterClass)local_e8 == 0x13;
LAB_00115f18:
          if (bVar60) goto LAB_00116045;
          goto LAB_00114d11;
        case 0x13:
          if ((ZydisRegisterClass)local_e8 != 0xd) goto LAB_00114d11;
          if ((*(ushort *)def_op & 0xa00) == 0) goto LAB_00116045;
          if ((local_128->reg).value == ZYDIS_REGISTER_CS) goto LAB_00114d11;
LAB_00115efb:
          bVar60 = false;
          break;
        case 0x14:
          if (((ZydisRegisterClass)local_e8 != 0x10) ||
             (((bVar19 = ZydisRegisterGetId((local_128->reg).value),
               (match.request)->machine_mode != ZYDIS_MACHINE_MODE_LONG_64 && (bVar19 == 8)) ||
              ((0xfee2UL >> ((ulong)bVar19 & 0x3f) & 1) != 0)))) goto LAB_00114d11;
          bVar60 = false;
          pZVar55 = local_128;
          break;
        case 0x15:
          if (((ZydisRegisterClass)local_e8 == 0x11) &&
             ((local_128->reg).value < ZYDIS_REGISTER_DR8)) goto LAB_00116045;
          goto LAB_00114d11;
        case 0x16:
          if ((ZydisRegisterClass)local_e8 != 0x12) goto LAB_00114d11;
          if ((*(ushort *)&(match.definition)->field_0x6 & 7) != 4) goto LAB_00116045;
          if ((*(byte *)((long)pZVar15->size + local_118 + 7) & 0x3f) == 6) {
            switch(*(ushort *)&match.base_definition[1].field_0x2 >> 2 & 3) {
            default:
              __assert_fail("(evex_def->mask_policy != ZYDIS_MASK_POLICY_INVALID) && (evex_def->mask_policy != ZYDIS_MASK_POLICY_FORBIDDEN)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x603,
                            "ZyanBool ZydisIsRegisterOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                           );
            case 1:
              goto switchD_00115d78_caseD_1;
            case 2:
              if ((local_128->reg).value == ZYDIS_REGISTER_K0) goto LAB_00114d11;
switchD_00115d78_caseD_1:
              if ((((*(ushort *)&match.base_definition[1].field_0x2 & 0xc) != 4) ||
                  (((match.request)->evex).zeroing_mask == '\0')) ||
                 ((local_128->reg).value != ZYDIS_REGISTER_K0)) goto LAB_00115efb;
              goto LAB_00114d11;
            }
          }
          bVar60 = false;
        }
        lVar53 = local_118;
        if ((bool)(pZVar55->reg).is4 != bVar60) goto LAB_00114d11;
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        switch(uVar48 & 0x3f) {
        default:
          local_118 = lVar53;
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x824,
                        "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                       );
        case 0x1f:
          local_118 = lVar53;
          if ((((pZVar55->mem).base != ZYDIS_REGISTER_NONE) ||
              ((pZVar55->mem).index != ZYDIS_REGISTER_NONE)) || ((pZVar55->mem).scale != '\0'))
          goto LAB_00114d11;
          bVar19 = ZydisGetSignedImmSize((pZVar55->mem).displacement);
          bVar21 = ZydisGetMaxAddressSize(match.request);
          if (bVar21 < bVar19) goto LAB_00114d11;
          if (match.eosz == '\0') {
            ZVar27 = ZydisGetOperandSizeFromElementSize
                               (&match,(ZyanU16 *)((long)pZVar15->size + local_118),
                                (local_128->mem).size,'\x01');
            match.eosz = ZVar27;
            if (ZVar27 == '\0') goto LAB_00114d11;
          }
          else if (*(ZyanU16 *)((long)pZVar15->size + local_118 + (ulong)(match.eosz >> 5) * 2) !=
                   (local_128->mem).size) goto LAB_00114d11;
          ZVar27 = ZydisGetEffectiveImmSize(&match,(local_128->mem).displacement,def_op);
          match.disp_size = ZVar27;
          pZVar55 = local_128;
          lVar53 = local_118;
          if (ZVar27 == '@') {
            if (0x3f < bVar19) break;
            goto LAB_00114d11;
          }
          if (ZVar27 == '\0') goto LAB_00114d11;
          break;
        case 0x20:
          local_118 = lVar53;
          if ((pZVar55->mem).scale != '\0') goto LAB_00114d11;
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1e:
          uVar38 = (pZVar55->mem).displacement;
          if (uVar38 == 0) {
            local_118 = lVar53;
            local_88 = 0;
            goto LAB_001155bf;
          }
          local_118 = lVar53;
          local_e8 = uVar38;
          bVar19 = ZydisGetSignedImmSize(uVar38);
          if (bVar19 < 0x21) {
            uVar48 = *(ushort *)&(match.definition)->field_0x6 & 7;
            local_88 = bVar19;
            if (uVar48 < 4) {
switchD_00115ced_caseD_0:
              match.cd8_scale = '\0';
              goto LAB_001155bf;
            }
            if (uVar48 == 5) {
              uVar9 = *(uint3 *)(match.base_definition + 1);
              if ((uVar9 & 0x1c000) != 0 && (uVar9 & 0x2000) != 0) {
                __assert_fail("!index || !mvex_def->broadcast",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x457,
                              "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                             );
              }
              local_70 = match.base_definition;
              if ((uVar9 & 0x2000) == 0) {
                uVar32 = uVar9 >> 0xe & 7;
                uStack_140 = (ulong)uVar32;
                if (uVar32 - 1 < 2) goto LAB_00115c74;
                if (uVar32 - 3 < 2) {
                  bVar60 = false;
                  uStack_140 = 2;
                  goto LAB_00115c84;
                }
                if ((uVar9 >> 0xe & 7) != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                ,0x465,
                                "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                               );
                }
                bVar60 = true;
                local_e9 = 6;
              }
              else {
LAB_00115c74:
                bVar60 = true;
                uStack_140 = 1;
LAB_00115c84:
                local_e9 = 3;
              }
              bVar21 = ZydisEncodeMvexBroadcastMode(((match.request)->mvex).broadcast);
              bVar23 = ZydisEncodeMvexConversionMode(((match.request)->mvex).conversion);
              uVar48 = *(ushort *)(local_70 + 1) >> 6 & 0x1f;
              if (0x19 < uVar48) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x4b4,
                              "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                             );
              }
              puVar45 = (undefined3 *)(ulong)(bVar23 | bVar21);
              switch(uVar48) {
              default:
                goto switchD_00115ced_caseD_0;
              case 4:
              case 5:
              case 6:
              case 7:
                bVar21 = 6;
                break;
              case 10:
              case 0xb:
              case 0xc:
              case 0x12:
                puVar35 = ZydisGetCompDispScaleMvex_lookup;
                goto LAB_001163f6;
              case 0xd:
              case 0x11:
              case 0x13:
              case 0x15:
                if (2 < (bVar23 | bVar21)) {
                  __assert_fail("sss < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                ,0x4a0,
                                "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                               );
                }
                puVar35 = ZydisGetCompDispScaleMvex_lookup_38 + uStack_140 * 3;
                goto LAB_00116597;
              case 0xe:
              case 0xf:
              case 0x10:
              case 0x14:
                puVar35 = ZydisGetCompDispScaleMvex_lookup_37;
LAB_001163f6:
                puVar35 = puVar35 + uStack_140 * 8;
                goto LAB_001166a6;
              case 0x16:
              case 0x18:
                if (!bVar60) {
                  __assert_fail("index < 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                ,0x4ab,
                                "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                               );
                }
                puVar35 = ZydisGetCompDispScaleMvex_lookup_39 + uStack_140 * 8;
LAB_00116597:
                pbVar36 = puVar35 + (long)puVar45;
                goto LAB_001166ae;
              case 0x17:
              case 0x19:
                bVar21 = local_e9;
                if (!bVar60) {
                  __assert_fail("index < 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                ,0x4b1,
                                "ZyanU8 ZydisGetCompDispScaleMvex(const ZydisEncoderInstructionMatch *)"
                               );
                }
              }
              goto LAB_001166d6;
            }
            if (uVar48 != 4) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x4cd,
                            "ZyanU8 ZydisGetCompDispScale(const ZydisEncoderInstructionMatch *)");
            }
            bVar21 = match.base_definition[1].field_0x1;
            if ((bVar21 & 0x1f) == 0) {
              __assert_fail("evex_def->tuple_type",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x3ce,
                            "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                           );
            }
            if (bVar21 < 0x20) {
              __assert_fail("evex_def->element_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x3cf,
                            "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                           );
            }
            if (0xbf < bVar21) {
              __assert_fail("evex_def->element_size < (sizeof(size_indexes) / sizeof((size_indexes)[0]))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x3d5,
                            "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                           );
            }
            if (0xf < (bVar21 & 0x1f) - 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x446,
                            "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                           );
            }
            bVar23 = (match.definition)->field_0x8;
            bVar24 = bVar21 >> 5;
            puVar35 = (undefined1 *)
                      (ulong)*(byte *)((long)&ZydisGetCompDispScaleEvex_size_indexes + (ulong)bVar24
                                      );
            puVar45 = (undefined3 *)(ulong)(byte)((bVar23 >> 3 & 3) - 1);
            switch(bVar21 & 0x1f) {
            case 1:
              if (bVar24 == 5) {
                __assert_fail("size_index < 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x3e1,
                              "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                             );
              }
              pbVar36 = ZydisGetCompDispScaleEvex_scales +
                        (long)puVar45 +
                        (long)puVar35 * 3 +
                        (ulong)(((match.request)->evex).broadcast != ZYDIS_BROADCAST_MODE_INVALID) *
                        9;
              goto LAB_001166ae;
            case 2:
              if (bVar24 == 5) {
                __assert_fail("size_index < 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x3ec,
                              "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                             );
              }
              puVar50 = (undefined6 *)
                        (ZydisGetCompDispScaleEvex_scales_25 +
                        (ulong)(((match.request)->evex).broadcast != ZYDIS_BROADCAST_MODE_INVALID) *
                        6);
              goto LAB_00116682;
            case 3:
              puVar34 = &ZydisGetCompDispScaleEvex_scales_26;
              break;
            default:
              pbVar36 = (byte *)((long)&ZydisGetCompDispScaleEvex_scales_27 + (ulong)bVar24);
              goto LAB_001166ae;
            case 5:
              if (bVar24 == 5) {
                __assert_fail("size_index < 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0x40e,
                              "ZyanU8 ZydisGetCompDispScaleEvex(const ZydisEncoderInstructionMatch *)"
                             );
              }
              puVar45 = &ZydisGetCompDispScaleEvex_scales_32;
              goto LAB_001166a6;
            case 6:
            case 0xe:
              bVar21 = 4;
              goto LAB_001166d6;
            case 8:
              bVar21 = 4 - ((bVar23 & 4) == 0);
              goto LAB_001166d6;
            case 9:
              bVar21 = (bVar23 & 4) == 0 ^ 5;
              goto LAB_001166d6;
            case 10:
              bVar21 = 5;
LAB_001166d6:
              match.cd8_scale = bVar21;
              goto LAB_001166dd;
            case 0xb:
              puVar34 = &ZydisGetCompDispScaleEvex_scales_30;
              break;
            case 0xc:
              puVar34 = &ZydisGetCompDispScaleEvex_scales_31;
              break;
            case 0xd:
              puVar34 = &ZydisGetCompDispScaleEvex_scales_32;
              break;
            case 0xf:
              puVar34 = &ZydisGetCompDispScaleEvex_scales_33;
              break;
            case 0x10:
              puVar35 = (undefined1 *)
                        (ulong)(((match.request)->evex).broadcast != ZYDIS_BROADCAST_MODE_INVALID);
              puVar50 = &ZydisGetCompDispScaleEvex_scales_34;
LAB_00116682:
              puVar35 = (undefined1 *)((long)puVar35 * 3 + (long)puVar50);
LAB_001166a6:
              pbVar36 = puVar35 + (long)puVar45;
              goto LAB_001166ae;
            }
            pbVar36 = (byte *)((long)puVar45 + (long)puVar34);
LAB_001166ae:
            bVar21 = *pbVar36;
            match.cd8_scale = bVar21;
            if (bVar21 != 0) {
LAB_001166dd:
              if (((uint)local_e8 & ~(-1 << (bVar21 & 0x1f))) == 0) {
                ZVar27 = ZydisGetSignedImmSize((long)local_e8 >> (bVar21 & 0x3f));
                local_88 = 8;
                if (ZVar27 != '\b') {
                  local_88 = bVar19;
                }
              }
              else if (bVar19 == 8) {
                local_88 = 0x10;
              }
            }
LAB_001155bf:
            if ((undefined1  [13])((undefined1  [13])*def_op & (undefined1  [13])0x3f) ==
                (undefined1  [13])0x1e) {
              uVar48 = (local_128->mem).size;
              if (match.easz == '\0') {
                if ((8 < uVar48) || ((0x114U >> (uVar48 & 0x1f) & 1) == 0)) goto LAB_00114d11;
                match.easz = (char)uVar48 << 3;
              }
              else {
                bVar60 = uVar48 == match.easz;
LAB_00115609:
                if (!bVar60) goto LAB_00114d11;
              }
            }
            else {
              if (match.eosz != '\0') {
                bVar60 = *(ZyanU16 *)
                          ((long)pZVar15->size + local_118 + (ulong)(match.eosz >> 5) * 2) ==
                         (local_128->mem).size;
                goto LAB_00115609;
              }
              if ((((match.definition)->field_0x8 & 0x18) == 0) &&
                 ((*(ushort *)&(match.definition)->field_0x6 & 7) != 5)) {
                if (((match.definition)->field_0x8 & 4) == 0) {
                  ZVar27 = ZydisGetOperandSizeFromElementSize
                                     (&match,(ZyanU16 *)((long)pZVar15->size + local_118),
                                      (local_128->mem).size,'\x01');
                  match.eosz = ZVar27;
                  if (ZVar27 == '\0') goto LAB_00114d11;
                }
                else {
                  match.eosz = '@';
                }
              }
              else {
                bVar19 = ZydisGetMachineModeWidth((match.request)->machine_mode);
                bVar19 = bVar19 >> 5;
                uVar38 = 1;
                if (bVar19 != 2) {
                  uVar38 = (ulong)bVar19;
                }
                uVar39 = (ulong)bVar19;
                if (match.eosz64_forbidden != '\0') {
                  uVar39 = uVar38;
                }
                uVar48 = *(ushort *)((long)pZVar15->size + local_118 + uVar39 * 2);
                if (uVar48 == 0) {
                  uVar32 = *(ushort *)&(match.definition)->field_0x6 & 7;
                  if (uVar32 - 4 < 2) {
                    switch((byte)(match.definition)->field_0x8 >> 3 & 3) {
                    case 0:
                      if ((short)uVar32 != 5) {
                        __assert_fail("match->definition->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                      ,0x674,
                                      "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                     );
                      }
                    case 3:
                      uVar52 = 0x40;
                      break;
                    case 1:
                      uVar52 = 0x10;
                      break;
                    case 2:
                      uVar52 = 0x20;
                    }
                    if ((short)uVar32 == 4) {
                      bVar19 = match.base_definition[1].field_0x1;
                      if (0xbf < bVar19) {
                        __assert_fail("evex_def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                      ,0x684,
                                      "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                     );
                      }
                      uVar48 = (ushort)*(byte *)((long)&ZydisIsMemoryOperandCompatible_element_sizes
                                                + (ulong)(bVar19 >> 5));
                      if (((((match.request)->evex).broadcast == ZYDIS_BROADCAST_MODE_INVALID) &&
                          ((*(ushort *)&match.base_definition[1].field_0x2 & 0x780) == 0)) &&
                         (uVar48 = uVar52, (bVar19 & 0x1f) != 1)) {
                        if ((bVar19 & 0x1f) == 0x10) {
                          uVar48 = uVar52 >> 2;
                        }
                        else {
                          if ((bVar19 & 0x1f) != 2) {
                            __assert_fail("0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                          ,0x697,
                                          "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                         );
                          }
                          uVar48 = uVar52 >> 1;
                        }
                      }
                    }
                    else {
                      ZVar29 = ((match.request)->mvex).conversion;
                      if (ZYDIS_CONVERSION_MODE_MAX_VALUE < ZVar29) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                      ,0x6cf,
                                      "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                     );
                      }
                      if ((0x32U >> (ZVar29 & 0x1f) & 1) == 0) {
                        if ((0xcU >> (ZVar29 & 0x1f) & 1) == 0) {
                          uVar32 = (*(ushort *)(match.base_definition + 1) >> 6 & 0x1f) - 10;
                          if (0xf < uVar32) {
                            __assert_fail("0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                          ,0x6c0,
                                          "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                         );
                          }
                          uVar48 = *(ushort *)(&DAT_0013b9b4 + (ulong)uVar32 * 2);
                          uVar52 = *(ushort *)(&DAT_0013b9d4 + (ulong)uVar32 * 2);
                        }
                        else {
                          uVar52 = 0x10;
                          uVar48 = 1;
                        }
                      }
                      else {
                        uVar52 = 0x20;
                        uVar48 = 2;
                      }
                      if (((*(uint3 *)(match.base_definition + 1) & 0x1c000) != 0) &&
                         (((match.request)->mvex).broadcast != ZYDIS_BROADCAST_MODE_INVALID)) {
                        __assert_fail("!mvex_def->broadcast || !match->request->mvex.broadcast",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                      ,0x6d1,
                                      "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                     );
                      }
                      uVar9 = *(uint3 *)(match.base_definition + 1) >> 0xe;
                      uVar32 = uVar9 & 7;
                      uVar49 = uVar48;
                      if (1 < uVar32 - 1) {
                        if (uVar32 - 3 < 2) {
                          uVar49 = uVar48 * 4;
                        }
                        else {
                          uVar49 = uVar52;
                          if ((uVar9 & 7) != 0) {
                            __assert_fail("0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                          ,0x6df,
                                          "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                         );
                          }
                        }
                      }
                      ZVar30 = ((match.request)->mvex).broadcast;
                      if (1 < ZVar30 - ZYDIS_BROADCAST_MODE_1_TO_8) {
                        if (ZVar30 - ZYDIS_BROADCAST_MODE_4_TO_8 < 2) {
                          uVar48 = uVar48 << 2;
                        }
                        else {
                          uVar48 = uVar49;
                          if (ZVar30 != ZYDIS_BROADCAST_MODE_INVALID) {
                            __assert_fail("0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                          ,0x6ee,
                                          "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                         );
                          }
                        }
                      }
                    }
                  }
                  else {
                    if (uVar32 != 3) {
                      __assert_fail("(match->definition->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (match->definition->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                                    ,0x66a,
                                    "ZyanBool ZydisIsMemoryOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                                   );
                    }
                    uVar48 = 0;
                  }
                }
                if ((local_128->mem).size != uVar48) goto LAB_00114d11;
              }
            }
            uVar48 = *(ushort *)def_op & 0x3f;
            if (uVar48 == 0x18) {
              iVar43 = 7;
LAB_0011577f:
              bVar60 = false;
            }
            else {
              if (uVar48 == 0x1a) {
                iVar43 = 9;
                goto LAB_0011577f;
              }
              if (uVar48 == 0x19) {
                iVar43 = 8;
                goto LAB_0011577f;
              }
              iVar43 = 0;
              bVar60 = true;
            }
            ZVar44 = (local_128->mem).base;
            ZVar58 = ZVar44 & ~ZYDIS_REGISTER_AL;
            if (((ZVar58 != ZYDIS_REGISTER_EIP) ||
                ((((match.base_definition)->field_0xa & 0x20) == 0 &&
                 (((match.definition)->modrm & 7) != 4)))) &&
               ((ZVar31 = ZydisRegisterGetClass(ZVar44), ZVar31 != ZYDIS_REGCLASS_INVALID ||
                ((local_128->mem).base == ZYDIS_REGISTER_NONE)))) {
              local_70 = (ZydisInstructionDefinition *)CONCAT44(local_70._4_4_,ZVar31);
              ZVar31 = ZydisRegisterGetClass((local_128->mem).index);
              local_e8 = CONCAT44(local_e8._4_4_,ZVar31);
              if ((ZVar31 != ZYDIS_REGCLASS_INVALID) ||
                 ((local_128->mem).index == ZYDIS_REGISTER_NONE)) {
                if (bVar60) {
                  ZVar22 = ZydisIsValidAddressingClass
                                     (&match,(ZydisRegisterClass)local_70,(local_128->mem).base);
                  if ((ZVar22 == '\0') &&
                     ((ZVar58 != ZYDIS_REGISTER_EIP ||
                      ((match.request)->machine_mode != ZYDIS_MACHINE_MODE_LONG_64))))
                  goto LAB_00114d11;
                  ZVar22 = ZydisIsValidAddressingClass
                                     (&match,(ZydisRegisterClass)local_e8,(local_128->mem).index);
                  if ((ZVar22 == '\0') ||
                     (((((ZydisRegisterClass)local_70 != ZYDIS_REGCLASS_INVALID &&
                        ((ZydisRegisterClass)local_e8 != ZYDIS_REGCLASS_INVALID)) &&
                       ((ZydisRegisterClass)local_70 != (ZydisRegisterClass)local_e8)) ||
                      (ZVar31 = (ZydisRegisterClass)local_70,
                      ((local_128->mem).index | ZYDIS_REGISTER_R11B) == ZYDIS_REGISTER_RSP))))
                  goto LAB_00114d11;
                }
                else {
                  ZVar27 = ZydisGetMachineModeWidth((match.request)->machine_mode);
                  ZVar25 = ZydisRegisterGetId((local_128->mem).index);
                  if ((((ZydisRegisterClass)local_70 != ZYDIS_REGCLASS_GPR64 ||
                        (match.request)->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
                      ((ZydisRegisterClass)local_70 != ZYDIS_REGCLASS_GPR32)) &&
                     ((ZydisRegisterClass)local_70 != ZYDIS_REGCLASS_INVALID)) goto LAB_00114d11;
                  if (ZVar27 == '@' || (ZydisRegisterClass)local_70 != ZYDIS_REGCLASS_GPR32) {
                    uVar32 = 7;
                    ZVar31 = (ZydisRegisterClass)local_70;
                    if (ZVar27 == '@') {
                      uVar32 = (uint)((*(ushort *)&(match.definition)->field_0x6 & 7) != 3) << 4 |
                               0xf;
                    }
                  }
                  else {
                    ZVar26 = ZydisRegisterGetId((local_128->mem).base);
                    uVar32 = 7;
                    ZVar31 = (ZydisRegisterClass)local_70;
                    if ('\a' < ZVar26) goto LAB_00114d11;
                  }
                  if (((ZydisRegisterClass)local_e8 != iVar43) || ((int)uVar32 < (int)ZVar25))
                  goto LAB_00114d11;
                }
                ZVar27 = (local_128->mem).scale;
                if ((ZydisRegisterClass)local_e8 == ZYDIS_REGCLASS_INVALID) {
                  if (ZVar27 != '\0') goto LAB_00114d11;
                  if (ZVar31 != ZYDIS_REGCLASS_INVALID) goto LAB_001159fb;
                  if ((local_88 != 8) || (match.cd8_scale == '\0')) {
                    bVar19 = ZydisGetMaxAddressSize(match.request);
                    if (local_88 <= bVar19) {
                      bVar21 = match.easz;
                      if (match.easz == '\0') {
                        bVar21 = 0x10;
                      }
                      if (((bVar21 == 0x40) ||
                          ((bVar21 == 0x10 && (((match.definition)->field_0x7 & 4) == 0)))) ||
                         ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                        uVar38 = (local_128->mem).displacement;
                        bVar21 = 0x20;
                        if ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                          bVar60 = true;
                          bVar23 = bVar19;
                          local_88 = 0x20;
                          if (-1 < (long)uVar38 && bVar19 == 0x20) {
                            bVar23 = (match.easz != ' ') * ' ' + 0x20;
                          }
                          goto LAB_00115b86;
                        }
                      }
                      else {
                        if (bVar21 < local_88) {
                          bVar21 = local_88;
                        }
                        uVar38 = (local_128->mem).displacement;
                      }
                      bVar60 = true;
                      bVar23 = bVar21;
                      local_88 = bVar21;
                      if (bVar21 < bVar19) {
                        uVar38 = uVar38 & ~(-2L << (bVar19 - 1 & 0x3f));
                        bVar24 = 8;
                        if ((0xff < uVar38) && (bVar24 = 0x10, 0xffff < uVar38)) {
                          bVar24 = (uVar38 >> 0x20 != 0) * ' ' + 0x20;
                        }
                        bVar23 = bVar19;
                        local_88 = bVar19;
                        if (bVar24 <= bVar21) {
                          bVar23 = bVar21;
                          local_88 = bVar21;
                        }
                      }
                      goto LAB_00115b86;
                    }
                    goto LAB_00114d11;
                  }
                  bVar23 = 0;
                  local_88 = 8;
LAB_00115a2e:
                  bVar60 = false;
                }
                else {
                  if ((ZVar27 == '\0') &&
                     ((undefined1  [13])((undefined1  [13])*def_op & (undefined1  [13])0x3f) !=
                      (undefined1  [13])0x20)) goto LAB_00114d11;
                  if (ZVar31 != ZYDIS_REGCLASS_INVALID) {
LAB_001159fb:
                    if (ZVar58 == ZYDIS_REGISTER_EIP) {
                      bVar23 = ((local_128->mem).base == ZYDIS_REGISTER_RIP) * ' ' + 0x20;
                    }
                    else {
                      ZVar28 = ZydisRegisterClassGetWidth((match.request)->machine_mode,ZVar31);
                      bVar23 = (byte)ZVar28;
                    }
                    goto LAB_00115a2e;
                  }
                  if (bVar60) {
                    ZVar28 = ZydisRegisterClassGetWidth
                                       ((match.request)->machine_mode,(ZydisRegisterClass)local_e8);
                    bVar23 = (byte)ZVar28;
                  }
                  else {
                    bVar23 = ZydisGetMachineModeWidth((match.request)->machine_mode);
                  }
                  bVar60 = false;
                }
LAB_00115b86:
                pZVar55 = local_128;
                ZVar2 = (match.request)->machine_mode;
                if (ZVar2 == ZYDIS_MACHINE_MODE_LONG_64) {
                  if (ZVar58 == ZYDIS_REGISTER_EIP && (ZydisRegisterClass)local_e8 != 0)
                  goto LAB_00114d11;
                }
                else if ((bVar23 == 0x10 && !bVar60) &&
                        (((0x10 < local_88 ||
                          (ZVar25 = ZydisGetRm16((local_128->mem).base,(local_128->mem).index),
                          ZVar25 == -1)) || ((bool)(pZVar55->mem).scale != ZVar25 < '\x04'))))
                goto LAB_00114d11;
                if (match.easz == '\0') {
                  match.easz = bVar23;
                }
                else if (match.easz != bVar23) goto LAB_00114d11;
                if ((((undefined1  [12])*match.base_definition & (undefined1  [12])0x3000000000) !=
                     (undefined1  [12])0x1000000000) ||
                   (bVar19 = ZydisGetMachineModeWidth(ZVar2), pZVar55 = local_128, bVar23 == bVar19)
                   ) {
                  match.disp_size = local_88;
                  lVar53 = local_118;
                  break;
                }
              }
            }
          }
          goto LAB_00114d11;
        }
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        if (match.eosz != '\0') {
          __assert_fail("match->eosz == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x835,
                        "ZyanBool ZydisIsPointerOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *)"
                       );
        }
        if ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
          __assert_fail("match->request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x836,
                        "ZyanBool ZydisIsPointerOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *)"
                       );
        }
        if (((match.request)->branch_type != ZYDIS_BRANCH_TYPE_NONE) &&
           ((match.request)->branch_type != ZYDIS_BRANCH_TYPE_FAR)) {
          __assert_fail("(match->request->branch_type == ZYDIS_BRANCH_TYPE_NONE) || (match->request->branch_type == ZYDIS_BRANCH_TYPE_FAR)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0x838,
                        "ZyanBool ZydisIsPointerOperandCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *)"
                       );
        }
        uVar32 = (pZVar55->ptr).offset;
        bVar19 = (0xffff < uVar32) * '\x10' + 0x10;
        if (uVar32 < 0x100) {
          bVar19 = 8;
        }
        if ((match.request)->branch_width == ZYDIS_BRANCH_WIDTH_NONE) {
          bVar21 = ZydisGetMachineModeWidth((match.request)->machine_mode);
        }
        else {
          bVar21 = (byte)(4 << ((byte)(match.request)->branch_width & 0x1f));
        }
        uVar16 = match._40_8_;
        if (bVar19 <= bVar21) {
          match.disp_size = bVar21;
          uVar10 = match._41_2_;
          match.easz = (char)uVar10;
          match.disp_size = (char)((ushort)uVar10 >> 8);
          match.eosz = bVar21;
          match._44_4_ = SUB84(uVar16,4);
          match.imm_size = '\x10';
          pZVar55 = local_128;
          break;
        }
        goto LAB_00114d11;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        uVar32 = uVar48 & 0x3f;
        if (1 < uVar32 - 0x1b) {
          if (uVar32 != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0x877,
                          "ZyanBool ZydisIsImmediateOperandCompabile(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                         );
          }
          if ((pZVar55->imm).u == 1) break;
          goto LAB_00114d11;
        }
        ZVar20 = ZydisGetEffectiveImmSize(&match,(pZVar55->imm).s,def_op);
        ZVar27 = match.imm_size;
        if ((*(byte *)((long)pZVar15->size + lVar53 + 7) & 0x3f) == 5) {
          if (match.imm_size != '\0') {
            __assert_fail("match->imm_size == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0x86c,
                          "ZyanBool ZydisIsImmediateOperandCompabile(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                         );
          }
          if (ZVar20 != '\b') goto LAB_00114d11;
        }
        else {
          if (ZVar20 == '\0') goto LAB_00114d11;
          if (match.imm_size != '\0') {
            if (match.disp_size != '\0') {
              __assert_fail("match->disp_size == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0x866,
                            "ZyanBool ZydisIsImmediateOperandCompabile(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, const ZydisOperandDefinition *)"
                           );
            }
            match.disp_size = ZVar27;
          }
        }
        match.imm_size = ZVar20;
        match.has_rel_operand =
             (undefined1  [13])((undefined1  [13])*def_op & (undefined1  [13])0x3f) ==
             (undefined1  [13])0x1c;
        pZVar55 = local_128;
      }
      lVar53 = lVar53 + 0xd;
      pZVar55 = pZVar55 + 1;
      uVar38 = local_e0 + 1;
    }
    uVar32 = *(uint *)&(match.base_definition)->field_0x8 >> 5 & 3;
    if (uVar32 == 0) goto switchD_00116844_caseD_0;
    switch(request->branch_width) {
    case ZYDIS_BRANCH_WIDTH_NONE:
      goto switchD_00116844_caseD_0;
    case ZYDIS_BRANCH_WIDTH_8:
      if ((uVar32 != 1) || (match.has_rel_operand == '\0')) goto LAB_00114d11;
      goto switchD_00116844_caseD_0;
    case ZYDIS_BRANCH_WIDTH_16:
      ZVar27 = '\x10';
      break;
    case ZYDIS_BRANCH_WIDTH_32:
      ZVar27 = ' ';
      if ((match.has_rel_operand != '\0') &&
         ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
        ZVar27 = (((undefined1  [12])*match.base_definition & (undefined1  [12])0xe00000000) ==
                 (undefined1  [12])0xa00000000) * ' ' + ' ';
      }
      break;
    case ZYDIS_BRANCH_WIDTH_64:
      if (match.has_rel_operand != '\0') goto LAB_00114d11;
      ZVar27 = '@';
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0xabf,
                    "ZyanBool ZydisIsDefinitionCompatible(ZydisEncoderInstructionMatch *, const ZydisEncoderRequest *)"
                   );
    }
    if (match.eosz == '\0') {
      match.eosz = ZVar27;
switchD_00116844_caseD_0:
      uVar48 = *(ushort *)&(match.definition)->field_0x6 & 7;
      if (uVar48 == 5) {
        uVar38 = (ulong)(*(uint3 *)(match.base_definition + 1) >> 3);
LAB_00116a85:
        if (((uVar38 & 1) != 0) &&
           ((match.request)->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER)) {
          if ((match.request)->operand_count != '\x03') {
            __assert_fail("match->request->operand_count == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0xa57,
                          "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
          }
          if ((match.request)->operands[2].type != ZYDIS_OPERAND_TYPE_MEMORY) {
            __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_MEMORY",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0xa59,
                          "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
          }
          ZVar25 = ZydisRegisterGetId((match.request)->operands[0].reg.value);
          ZVar26 = ZydisRegisterGetId(pZVar13->operands[2].mem.index);
          if (ZVar25 == ZVar26) goto LAB_00114d11;
        }
      }
      else {
        if (uVar48 == 4) {
          uVar38 = ((ulong)*(byte *)(match.base_definition + 1) << 0x20) >> 0x23;
          if ((*(uint5 *)&(match.base_definition)->field_0x8 & 0x1000000000) != 0) {
            if ((match.request)->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa39,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if ((match.request)->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa3a,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            ZVar4 = (match.request)->operands[3].type;
            if (1 < ZVar4 - ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("(operands[3].type == ZYDIS_OPERAND_TYPE_REGISTER) || (operands[3].type == ZYDIS_OPERAND_TYPE_MEMORY)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa3c,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            ZVar44 = ZYDIS_REGISTER_NONE;
            if (ZVar4 == ZYDIS_OPERAND_TYPE_REGISTER) {
              ZVar44 = (match.request)->operands[3].reg.value;
            }
            ZVar58 = (match.request)->operands[0].reg.value;
            if ((ZVar58 == (match.request)->operands[2].reg.value) || (ZVar58 == ZVar44))
            goto LAB_00114d11;
          }
          goto LAB_00116a85;
        }
        if (uVar48 == 3) {
          uVar8 = *(uint6 *)&(match.base_definition)->field_0x8;
          if ((uVar8 & 0x800000000) != 0) {
            if ((match.request)->operand_count != '\x03') {
              __assert_fail("match->request->operand_count == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa11,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if ((match.request)->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa12,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if ((match.request)->operands[1].type != ZYDIS_OPERAND_TYPE_MEMORY) {
              __assert_fail("operands[1].type == ZYDIS_OPERAND_TYPE_MEMORY",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa13,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if ((match.request)->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa14,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            ZVar25 = ZydisRegisterGetId((match.request)->operands[0].reg.value);
            local_128 = (ZydisEncoderOperand *)CONCAT71(local_128._1_7_,ZVar25);
            ZVar25 = ZydisRegisterGetId(pZVar13->operands[1].mem.index);
            local_e0 = CONCAT71(local_e0._1_7_,ZVar25);
            ZVar25 = ZydisRegisterGetId(pZVar13->operands[2].reg.value);
            bVar60 = (char)local_128 == (char)local_e0;
            bVar61 = (char)local_128 == ZVar25;
            bVar62 = (char)local_e0 == ZVar25;
            if (bVar62 || (bVar61 || bVar60)) goto LAB_00114d11;
            uVar8 = *(uint6 *)&pZVar14->field_0x8;
          }
          if ((uVar8 >> 0x25 & 1) != 0) {
            if ((match.request)->operand_count != '\x03') {
              __assert_fail("match->request->operand_count == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa22,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if (pZVar13->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa23,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if (pZVar13->operands[1].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa24,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            if (pZVar13->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
              __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xa25,
                            "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
            }
            ZVar44 = pZVar13->operands[0].reg.value;
            ZVar58 = pZVar13->operands[1].reg.value;
            ZVar3 = pZVar13->operands[2].reg.value;
            if (ZVar44 == ZVar3 || (ZVar58 == ZVar3 || ZVar44 == ZVar58)) goto LAB_00114d11;
          }
        }
      }
      if ((char)(match.definition)->field_0x8 < '\0') {
        if ((match.request)->mnemonic == ZYDIS_MNEMONIC_XCHG) {
          if (((match.request)->operand_count != '\x02') ||
             ((match.request)->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER)) {
            __assert_fail("(match->request->operand_count == 2) && (match->request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0xb63,
                          "ZyanBool ZydisHandleSwappableDefinition(ZydisEncoderInstructionMatch *)")
            ;
          }
          ZVar44 = (match.request)->operands[0].reg.value;
          if (ZVar44 == ZYDIS_REGISTER_RAX) {
LAB_00116c5e:
            match._40_8_ = (ulong)(uint7)match._41_7_ << 8;
          }
          else if (ZVar44 == ZYDIS_REGISTER_EAX) {
            match._40_8_ = (ulong)(uint7)match._41_7_ << 8;
            ZVar27 = ZydisGetMachineModeWidth((match.request)->machine_mode);
            if (ZVar27 == '@') goto LAB_00116cf0;
          }
          else if (ZVar44 == ZYDIS_REGISTER_AX) goto LAB_00116c5e;
        }
        else if ((match.request)->mnemonic == ZYDIS_MNEMONIC_MOV) {
          if ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            bVar19 = ZydisGetSignedImmSize((match.request)->operands[1].imm.s);
            if ((match.eosz == '@') && (bVar19 < 0x40)) goto LAB_00116cf0;
          }
        }
        else {
          bVar19 = (match.request)->operand_count;
          if ((bVar19 & 0xfe) != 2) {
            __assert_fail("(match->request->operand_count == 2) || (match->request->operand_count == 3)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0xb73,
                          "ZyanBool ZydisHandleSwappableDefinition(ZydisEncoderInstructionMatch *)")
            ;
          }
          ZVar25 = ZydisRegisterGetId((match.request)->operands[0].reg.value);
          ZVar26 = ZydisRegisterGetId((match.request)->operands[(ulong)(bVar19 == 3) + 1].reg.value)
          ;
          if ((ZVar25 < '\b') && ('\a' < ZVar26)) {
            pZVar11 = match.definition + 1;
            pZVar1 = match.definition + 1;
            match.definition = match.definition + 1;
            ZydisGetInstructionDefinition
                      (*(ushort *)&pZVar11->field_0x6 &
                       (ZYDIS_INSTRUCTION_ENCODING_EVEX|ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS),
                       pZVar1->instruction_reference,&match.base_definition);
            match.operands = ZydisGetOperandDefinitions(match.base_definition);
LAB_00116cf0:
            if (definition == match.definition) goto LAB_00114d11;
            bVar51 = bVar51 + 1;
            _mmmmm = match.base_definition;
            definition = match.definition;
          }
        }
      }
      uVar48 = *(ushort *)&definition->field_0x6;
      if (match.easz == '\0') {
        uVar32 = uVar57;
        bVar19 = bVar18 & 0xf0;
        if ((uVar48 >> 10 & uVar57 & 7) == 0) {
          uVar32 = local_68;
          bVar19 = (bVar46 != 2) * '\x10' + 0x10;
        }
        match.easz = bVar19;
        uVar48 = *(ushort *)&definition->field_0x6;
        if ((uVar48 >> 10 & uVar32 & 7) == 0) {
          __assert_fail("definition->address_sizes & (match->easz >> 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xc07,
                        "ZyanStatus ZydisFindMatchingDefinition(const ZydisEncoderRequest *, ZydisEncoderInstructionMatch *)"
                       );
        }
      }
      else if (((uint)(uVar48 >> 10) & (uint)(match.easz >> 4) & 7) == 0) goto LAB_00114d11;
      bVar19 = match.eosz;
      if (bVar46 == 4) {
        uVar32 = (uint)((ulong)*(undefined8 *)_mmmmm >> 0x21) & 7;
        if (uVar32 != 5) {
          if (uVar32 == 4) {
            if (match.eosz == ' ') goto LAB_00114d11;
            if (match.eosz == '\0') {
              if ((uVar48 & 0xa000) == 0) {
                __assert_fail("definition->operand_sizes & (ZYDIS_WIDTH_16 | ZYDIS_WIDTH_64)",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                              ,0xc14,
                              "ZyanStatus ZydisFindMatchingDefinition(const ZydisEncoderRequest *, ZydisEncoderInstructionMatch *)"
                             );
              }
              match.eosz = 0x40;
              if (-1 < (short)uVar48) {
                match.eosz = 0x10;
              }
              goto LAB_00116d35;
            }
          }
          goto LAB_00116bfb;
        }
        if (match.eosz == '\0') {
          match.eosz = 0x40;
LAB_00116d35:
          bVar19 = match.eosz;
        }
        else if (match.eosz != '@') goto LAB_00114d11;
LAB_00116c03:
        if (((bVar19 == 0x40) && (match.eosz64_forbidden != '\0')) ||
           ((ushort)(*(ushort *)&definition->field_0x6 >> 0xd & (ushort)(bVar19 >> 4)) == 0))
        goto LAB_00114d11;
      }
      else {
LAB_00116bfb:
        if (match.eosz != '\0') goto LAB_00116c03;
        if (bVar46 == 4) {
          uVar57 = 2;
        }
        uVar48 = uVar48 >> 0xd;
        if ((uVar57 & uVar48) == 0) {
          match.eosz = '\x10';
          if ((uVar48 & 1) == 0) {
            match.eosz = ((uVar48 & 2) == 0) * ' ' + ' ';
          }
        }
        else {
          match.eosz = (char)uVar57 << 4;
        }
      }
      definition = local_48;
      local_108 = *local_58;
      local_100 = 0;
      local_f8->scale = '\0';
      local_f8->index = '\0';
      local_f8->base = '\0';
      local_f8->rex_w = '\0';
      local_f8->zeroing = '\0';
      local_f8->eviction_hint = '\0';
      local_f8->disp_size = '\0';
      local_f8->imm_size = '\0';
      local_f8->disp = 0;
      local_f8->encoding = ZYDIS_INSTRUCTION_ENCODING_LEGACY;
      local_f8->opcode_map = ZYDIS_OPCODE_MAP_DEFAULT;
      local_f8->opcode = '\0';
      local_f8->vvvv = '\0';
      local_f8->sss = '\0';
      local_f8->mask = '\0';
      local_f8->vector_length = '\0';
      local_f8->mod = '\0';
      local_f8->reg = '\0';
      local_f8->rm = '\0';
      local_f8->imm = 0;
      local_f8->attributes = match.attributes;
      local_f8->encoding =
           *(ushort *)&(match.definition)->field_0x6 &
           (ZYDIS_INSTRUCTION_ENCODING_EVEX|ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS);
      local_f8->opcode_map =
           *(ushort *)&(match.definition)->field_0x6 >> 3 &
           (ZYDIS_OPCODE_MAP_0F0F|ZYDIS_OPCODE_MAP_MAP7);
      local_f8->opcode = (match.definition)->opcode;
      local_f8->rex_w = (byte)(match.definition)->field_0x8 >> 2 & 1;
      bVar17 = (match.definition)->modrm;
      local_f8->mod = bVar17 >> 6;
      local_f8->reg = bVar17 >> 3 & 7;
      local_f8->rm = bVar17 & 7;
      ZVar37 = match.attributes;
      if (bVar17 != 0) {
        ZVar37 = match.attributes | 1;
        local_f8->attributes = ZVar37;
      }
      local_f8->vector_length = (ZyanU8)(0x2010000 >> ((match.definition)->field_0x8 & 0x18));
      uVar48 = *(ushort *)&(match.definition)->field_0x6 & 7;
      if (uVar48 == 5) {
        bVar17 = ZydisEncodeMvexBroadcastMode(((match.request)->mvex).broadcast);
        local_f8->sss = local_f8->sss | bVar17;
        bVar17 = ZydisEncodeMvexConversionMode(((match.request)->mvex).conversion);
        bVar17 = bVar17 | local_f8->sss;
        local_f8->sss = bVar17;
        ZVar5 = ((match.request)->mvex).rounding;
        if (ZVar5 - ZYDIS_ROUNDING_MODE_RN < 4) {
          bVar17 = (char)ZVar5 - 1U | bVar17;
          local_f8->sss = bVar17;
        }
        else if (ZVar5 != ZYDIS_ROUNDING_MODE_INVALID) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xf98,
                        "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                       );
        }
        ZVar6 = ((match.request)->mvex).swizzle;
        if (ZVar6 - ZYDIS_SWIZZLE_MODE_DCBA < 8) {
          bVar17 = (char)ZVar6 - 1U | bVar17;
          local_f8->sss = bVar17;
        }
        else if (ZVar6 != ZYDIS_SWIZZLE_MODE_INVALID) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xfaa,
                        "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                       );
        }
        if (((match.request)->mvex).sae == '\0') {
          if ((ZVar5 != ZYDIS_ROUNDING_MODE_INVALID) ||
             (((match.request)->mvex).eviction_hint != '\0')) {
            local_f8->eviction_hint = '\x01';
          }
        }
        else {
          local_f8->eviction_hint = '\x01';
          local_f8->sss = bVar17 | 4;
        }
        if ((match.request)->mnemonic - ZYDIS_MNEMONIC_VMOVNRNGOAPD < 2) {
          local_f8->eviction_hint = '\x01';
        }
        else if ((match.request)->mnemonic - ZYDIS_MNEMONIC_VMOVNRAPD < 2) {
          local_f8->eviction_hint = '\0';
          uVar38 = 0x80000000000;
          switch((match.definition)->field_0x8 & 3) {
          case 1:
            goto switchD_00117031_caseD_1;
          case 2:
            goto switchD_00117031_caseD_2;
          case 3:
            goto switchD_00117031_caseD_3;
          }
          goto switchD_00117031_caseD_0;
        }
LAB_0011700d:
        uVar38 = 0x80000000000;
        switch((match.definition)->field_0x8 & 3) {
        case 0:
          goto switchD_00117031_caseD_0;
        case 2:
switchD_00117031_caseD_2:
          uVar38 = 0x40000000;
          break;
        case 3:
switchD_00117031_caseD_3:
          uVar38 = 0x10000000;
        }
switchD_00117031_caseD_1:
        local_f8->attributes = local_f8->attributes | uVar38;
      }
      else {
        if (uVar48 != 4) goto LAB_0011700d;
        if ((*(ushort *)&match.base_definition[1].field_0x2 & 0x60) != 0x20) {
          local_f8->zeroing = ((match.request)->evex).zeroing_mask;
        }
        if ((((match.request)->evex).sae != '\0') ||
           (((match.request)->evex).broadcast != ZYDIS_BROADCAST_MODE_INVALID)) {
          ZVar37 = ZVar37 | 0x200000000000;
          local_f8->attributes = ZVar37;
        }
        ZVar5 = ((match.request)->evex).rounding;
        if (ZVar5 == ZYDIS_ROUNDING_MODE_INVALID) goto LAB_0011700d;
        local_f8->attributes = ZVar37 | 0x200000000000;
        switch(ZVar5) {
        case ZYDIS_ROUNDING_MODE_RN:
          local_f8->vector_length = '\0';
          uVar38 = 0x80000000000;
          switch((match.definition)->field_0x8 & 3) {
          case 0:
            goto switchD_00117031_caseD_0;
          case 2:
            goto switchD_00117031_caseD_2;
          case 3:
            goto switchD_00117031_caseD_3;
          }
          goto switchD_00117031_caseD_1;
        case ZYDIS_ROUNDING_MODE_RD:
          local_f8->vector_length = '\x01';
          uVar38 = 0x80000000000;
          switch((match.definition)->field_0x8 & 3) {
          case 1:
            goto switchD_00117031_caseD_1;
          case 2:
            goto switchD_00117031_caseD_2;
          case 3:
            goto switchD_00117031_caseD_3;
          }
          break;
        case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
          local_f8->vector_length = '\x02';
          uVar38 = 0x80000000000;
          switch((match.definition)->field_0x8 & 3) {
          case 1:
            goto switchD_00117031_caseD_1;
          case 2:
            goto switchD_00117031_caseD_2;
          case 3:
            goto switchD_00117031_caseD_3;
          }
          break;
        case ZYDIS_ROUNDING_MODE_MAX_VALUE:
          local_f8->vector_length = '\x03';
          uVar38 = 0x80000000000;
          switch((match.definition)->field_0x8 & 3) {
          case 1:
            goto switchD_00117031_caseD_1;
          case 2:
            goto switchD_00117031_caseD_2;
          case 3:
            goto switchD_00117031_caseD_3;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xf84,
                        "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                       );
        }
      }
switchD_00117031_caseD_0:
      ZVar27 = ZydisGetMachineModeWidth((match.request)->machine_mode);
      if (match.easz != ZVar27) {
        pbVar36 = (byte *)((long)&local_f8->attributes + 5);
        *pbVar36 = *pbVar36 | 0x10;
      }
      if (((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) &&
         (uVar56 = (uint)((ulong)*(undefined8 *)match.base_definition >> 0x21) & 7, uVar56 != 5)) {
        if (match.eosz == '@') {
          local_f8->rex_w = uVar56 != 4;
        }
        else if (match.eosz != ' ') {
          if (match.eosz != '\x10') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0xff0,
                          "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                         );
          }
          goto LAB_00117144;
        }
      }
      else if (match.eosz != ZVar27) {
LAB_00117144:
        local_f8->attributes = local_f8->attributes | 0x80000000000;
      }
      lVar53 = 0x68;
      lVar59 = 0;
      uVar38 = 0;
      pZVar54 = local_f8;
      break;
    }
    if (match.eosz == ZVar27) goto switchD_00116844_caseD_0;
LAB_00114d11:
    bVar51 = bVar51 + 1;
    definition = definition + 1;
  } while( true );
LAB_00117162:
  pZVar15 = match.operands;
  pZVar13 = match.request;
  pZVar12 = local_f8;
  if ((match.request)->operand_count <= uVar38) goto LAB_00117547;
  switch(*(undefined4 *)((long)(match.request)->operands + lVar53 + -0x68)) {
  case 1:
    if ((*(ushort *)((long)(match.operands)->size + lVar59 + -2) & 0x3f) == 1) break;
    ZVar31 = ZydisRegisterGetClass
                       (*(ZydisRegister *)((long)(match.request)->operands + lVar53 + -100));
    ZVar44 = *(ZydisRegister *)((long)pZVar13->operands + lVar53 + -100);
    if (ZVar31 == ZYDIS_REGCLASS_GPR8) {
      if (0x13 < (ulong)ZVar44 - 1) {
        __assert_fail("((ZyanUSize)user_op->reg.value - ZYDIS_REGISTER_AL) < (sizeof(reg8_lookup) / sizeof((reg8_lookup)[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xe86,
                      "void ZydisBuildRegisterOperand(const ZydisEncoderOperand *, const ZydisOperandDefinition *, ZydisEncoderInstruction *)"
                     );
      }
      bVar17 = ZydisBuildRegisterOperand_reg8_lookup[ZVar44 - ZYDIS_REGISTER_AL];
      if (ZVar44 - ZYDIS_REGISTER_REQUIRED_BITS < 4) {
        *(byte *)&local_f8->attributes = (byte)local_f8->attributes | 4;
      }
    }
    else {
      bVar17 = ZydisRegisterGetId(ZVar44);
    }
    pZVar54 = local_f8;
    switch(*(byte *)((long)pZVar15->size + lVar59 + 7) & 0x3f) {
    case 1:
      *(byte *)&local_f8->attributes = (byte)local_f8->attributes | 1;
      local_f8->reg = bVar17;
      break;
    case 2:
      *(byte *)&local_f8->attributes = (byte)local_f8->attributes | 1;
      goto LAB_0011742d;
    case 3:
      local_f8->opcode = local_f8->opcode + (bVar17 & 7);
LAB_0011742d:
      local_f8->rm = bVar17;
      break;
    case 4:
      local_f8->vvvv = bVar17;
      break;
    case 5:
      local_f8->imm_size = '\b';
      uVar39 = (ulong)bVar17 << 4;
      goto LAB_00117214;
    case 6:
      local_f8->mask = bVar17;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0xea7,
                    "void ZydisBuildRegisterOperand(const ZydisEncoderOperand *, const ZydisOperandDefinition *, ZydisEncoderInstruction *)"
                   );
    }
    break;
  case 2:
    if ((*(ushort *)((long)(match.operands)->size + lVar59 + -2) & 0x3f) == 0x1f) {
      pZVar54->disp_size = match.disp_size;
      pZVar54->disp = *(ZyanU64 *)((long)(match.request)->operands + lVar53 + -0x48);
      break;
    }
    uVar39 = pZVar54->attributes;
    pZVar54->attributes = uVar39 | 1;
    pZVar54->disp = *(ZyanU64 *)((long)(match.request)->operands + lVar53 + -0x48);
    if (match.easz == '\x10') {
      ZVar27 = ZydisGetRm16(*(ZydisRegister *)((long)(match.request)->operands + lVar53 + -0x58),
                            *(ZydisRegister *)((long)(match.request)->operands + lVar53 + -0x54));
      pZVar54 = local_f8;
      if (ZVar27 == 0xff) {
        local_f8->rm = '\x06';
        local_f8->disp_size = '\x10';
      }
      else {
        local_f8->rm = ZVar27;
        local_f8->disp_size = match.disp_size;
        if (match.disp_size != '\x10') {
          if (match.disp_size != '\b') {
            if (match.disp_size != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                            ,0xece,
                            "void ZydisBuildMemoryOperand(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, ZydisEncoderInstruction *)"
                           );
            }
            if (ZVar27 != '\x06') {
              ZVar27 = '\0';
              goto switchD_001174fd_caseD_0;
            }
            local_f8->disp_size = '\b';
          }
          local_f8->mod = '\x01';
          ZVar27 = '\b';
          goto switchD_001174fd_caseD_0;
        }
        local_f8->mod = '\x02';
      }
      ZVar27 = '\x10';
    }
    else {
      ZVar44 = *(ZydisRegister *)((long)(match.request)->operands + lVar53 + -0x58);
      if (*(int *)((long)(match.request)->operands + lVar53 + -0x54) == 0) {
        if (ZVar44 - ZYDIS_REGISTER_EIP < 2) {
          pZVar54->rm = '\x05';
        }
        else {
          if (ZVar44 != ZYDIS_REGISTER_NONE) goto LAB_0011737f;
          ZVar27 = '\x05';
          if ((match.request)->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            pZVar54->attributes = uVar39 | 3;
            pZVar54->index = '\x04';
            pZVar54->base = '\x05';
            ZVar27 = '\x04';
          }
          pZVar54->rm = ZVar27;
        }
        pZVar54->disp_size = ' ';
        ZVar27 = ' ';
        goto switchD_001174fd_caseD_0;
      }
LAB_0011737f:
      bVar17 = ZydisRegisterGetId(ZVar44);
      ZVar20 = ZydisRegisterGetId(*(ZydisRegister *)((long)pZVar13->operands + lVar53 + -0x54));
      local_f8->disp_size = match.disp_size;
      ZVar41 = '\x01';
      ZVar27 = match.disp_size;
      switch((uint)match.disp_size << 0x1d | (uint)(match.disp_size >> 3)) {
      case 0:
        if ((bVar17 & 0xf7) == 5) {
          local_f8->disp_size = '\b';
          local_f8->disp = 0;
          ZVar27 = '\b';
          break;
        }
        goto LAB_00117492;
      case 1:
        break;
      case 2:
        local_f8->disp_size = ' ';
        ZVar41 = '\x02';
        ZVar27 = ' ';
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xf0b,
                      "void ZydisBuildMemoryOperand(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, ZydisEncoderInstruction *)"
                     );
      case 4:
        ZVar41 = '\x02';
      }
      local_f8->mod = ZVar41;
LAB_00117492:
      pZVar54 = local_f8;
      if (((*(int *)((long)pZVar13->operands + lVar53 + -0x54) == 0) && ((bVar17 & 0xf7) != 4)) &&
         (((match.definition)->modrm & 7) != 4)) {
        local_f8->rm = bVar17;
      }
      else {
        local_f8->rm = '\x04';
        *(byte *)&local_f8->attributes = (byte)local_f8->attributes | 2;
        if (bVar17 == 0xff) {
          local_f8->mod = '\0';
          local_f8->disp_size = ' ';
          bVar17 = 5;
          ZVar27 = ' ';
        }
        if (ZVar20 == 0xff) {
          ZVar20 = '\x04';
        }
        local_f8->base = bVar17;
        local_f8->index = ZVar20;
        switch(*(undefined1 *)((long)pZVar13->operands + lVar53 + -0x50)) {
        case 0:
        case 1:
          break;
        case 2:
          local_f8->scale = '\x01';
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xf38,
                        "void ZydisBuildMemoryOperand(ZydisEncoderInstructionMatch *, const ZydisEncoderOperand *, ZydisEncoderInstruction *)"
                       );
        case 4:
          local_f8->scale = '\x02';
          break;
        case 8:
          local_f8->scale = '\x03';
        }
      }
    }
switchD_001174fd_caseD_0:
    if ((match.cd8_scale != '\0') && (ZVar27 == '\b')) {
      pZVar54->disp = pZVar54->disp >> (match.cd8_scale & 0x3f);
    }
    break;
  case 3:
    pZVar54->disp_size = match.disp_size;
    pZVar54->disp = (ulong)*(uint *)((long)(match.request)->operands + lVar53 + -0x34);
    pZVar54->imm_size = match.imm_size;
    uVar39 = (ulong)*(ushort *)((long)(match.request)->operands + lVar53 + -0x38);
LAB_00117214:
    pZVar54->imm = uVar39;
    break;
  case 4:
    if ((*(ushort *)((long)(match.operands)->size + lVar59 + -2) & 0x3f) != 3) {
      if ((*(byte *)((long)(match.operands)->size + lVar59 + 7) & 0x3f) != 5) {
        if (pZVar54->imm_size != '\0') {
          if (pZVar54->disp_size != '\0') {
            __assert_fail("instruction->disp_size == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0x1023,
                          "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                         );
          }
          pZVar54->disp_size = match.disp_size;
          pZVar54->disp = pZVar54->imm;
        }
        pZVar54->imm_size = match.imm_size;
        uVar39 = *(ulong *)((long)(match.request)->operands + lVar53 + -0x30);
        goto LAB_00117214;
      }
      if (pZVar54->imm_size != '\b') {
        __assert_fail("instruction->imm_size == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0x102c,
                      "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                     );
      }
      pZVar54->imm = pZVar54->imm | *(ulong *)((long)(match.request)->operands + lVar53 + -0x30);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x1031,
                  "ZyanStatus ZydisBuildInstruction(ZydisEncoderInstructionMatch *, ZydisEncoderInstruction *)"
                 );
  }
  uVar38 = uVar38 + 1;
  lVar59 = lVar59 + 0xd;
  lVar53 = lVar53 + 0x40;
  goto LAB_00117162;
LAB_00117547:
  ZVar7 = pZVar54->encoding;
  uVar38 = pZVar54->attributes;
  if (((uint)uVar38 >> 0x1b & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf0;
    uVar38 = pZVar54->attributes;
    local_100 = local_100 + 1;
  }
  uVar56 = ZVar7 - ZYDIS_INSTRUCTION_ENCODING_XOP;
  if (3 < uVar56) {
    if ((uVar38 & 0x1c0000000) != 0) {
      if (local_108 < local_100 + 1) {
        return 0x80100009;
      }
      *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf2;
      uVar38 = pZVar54->attributes;
      local_100 = local_100 + 1;
    }
    if ((uVar38 & 0x230000000) != 0) {
      if (local_108 < local_100 + 1) {
        return 0x80100009;
      }
      *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf3;
      uVar38 = pZVar54->attributes;
      local_100 = local_100 + 1;
    }
  }
  if ((uVar38 & 0x2400000000) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x2e;
    uVar38 = pZVar54->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x26 & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x36;
    uVar38 = pZVar54->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 & 0x8800000000) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x3e;
    uVar38 = pZVar54->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x28 & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x26;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x29 & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 100;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x2a & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x65;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x24 & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x3e;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((3 < uVar56) && (local_50 = local_50 & uVar38, local_50 != 0)) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x66;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 >> 0x2c & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x67;
    local_100 = local_100 + 1;
  }
  switch(local_f8->encoding) {
  case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
  case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    bVar17 = ZydisEncodeRexLowNibble(local_f8,(ZyanBool *)0x0);
    if ((bVar17 != 0) || ((local_f8->attributes & 4) != 0)) {
      if (local_108 < local_100 + 1) {
        return 0x80100009;
      }
      *(byte *)((long)&definition->instruction_reference + local_100) = bVar17 | 0x40;
      local_100 = local_100 + 1;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    ZydisEncodeVexCommons(local_f8,&mmmmm,&pp,&vvvv,&local_d1,(ZyanBool *)0x0);
    if (1 < pZVar12->vector_length) {
      __assert_fail("instruction->vector_length <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0xd8b,
                    "ZyanStatus ZydisEmitXop(ZydisEncoderInstruction *, ZydisEncoderBuffer *)");
    }
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    bVar17 = pZVar12->vector_length << 2 | (vvvv & 0xf) << 3 | (local_d1 & 8) << 4 | pp;
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x8f;
    uVar38 = local_100 + 2;
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + local_100 + 1) = ~local_d1 << 5 | mmmmm;
    local_100 = local_100 + 3;
LAB_00117a08:
    if (local_108 < local_100) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + uVar38) = bVar17;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    ZydisEncodeVexCommons(local_f8,&mmmmm,&pp,&vvvv,&local_d1,(ZyanBool *)0x0);
    bVar17 = pZVar12->vector_length;
    if (1 < bVar17) {
      __assert_fail("instruction->vector_length <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0xda0,
                    "ZyanStatus ZydisEmitVex(ZydisEncoderInstruction *, ZydisEncoderBuffer *)");
    }
    if ((local_d1 & 0xb) == 0 && mmmmm == '\x01') {
      uVar38 = local_100 + 1;
      if (local_108 < uVar38) {
        return 0x80100009;
      }
      bVar17 = (bVar17 << 2 | local_d1 << 5 | (vvvv & 0xf) << 3) + 0x80 | pp;
      *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xc5;
      local_100 = local_100 + 2;
      goto LAB_00117a08;
    }
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xc4;
    if (local_108 < local_100 + 2) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + local_100 + 1) = ~local_d1 << 5 | mmmmm;
    if (local_108 < local_100 + 3) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->operand_mask + local_100) =
         bVar17 << 2 | (vvvv & 0xf) << 3 | (local_d1 & 8) << 4 | pp;
    local_100 = local_100 + 3;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    ZydisEncodeEvexCommons(local_f8,&mmmmm,&pp,&vvvv);
    bVar18 = vvvv >> 1 & 8 | pZVar12->vector_length << 5 | pZVar12->mask;
    bVar17 = bVar18 | 0x80;
    if (pZVar12->zeroing == '\0') {
      bVar17 = bVar18;
    }
    bVar18 = bVar17 & 0xf7;
    if ((pZVar12->index & 0x10) == 0) {
      bVar18 = bVar17;
    }
    bVar18 = (byte)(pZVar12->attributes >> 0x29) & 0x10 | bVar18;
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x62;
    if (local_108 < local_100 + 2) {
      return 0x80100009;
    }
    *(ZyanU8 *)((long)&definition->instruction_reference + local_100 + 1) = mmmmm;
    uVar38 = local_100 + 3;
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    goto LAB_00117b85;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    ZydisEncodeEvexCommons(local_f8,&mmmmm,&pp,&vvvv);
    bVar18 = vvvv >> 1 & 8 | pZVar12->sss << 4 | pZVar12->mask;
    bVar17 = bVar18 | 0x80;
    if (pZVar12->eviction_hint == '\0') {
      bVar17 = bVar18;
    }
    bVar18 = bVar17 & 0xf7;
    if ((pZVar12->index & 0x10) == 0) {
      bVar18 = bVar17;
    }
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0x62;
    if (local_108 < local_100 + 2) {
      return 0x80100009;
    }
    *(ZyanU8 *)((long)&definition->instruction_reference + local_100 + 1) = mmmmm;
    uVar38 = local_100 + 3;
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    pp = pp & 0xfb;
LAB_00117b85:
    *(ZyanU8 *)((long)&definition->operand_mask + local_100) = pp;
    if (local_108 < local_100 + 4) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + uVar38) = bVar18;
    local_100 = local_100 + 4;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0xe2d,
                  "ZyanStatus ZydisEmitInstruction(ZydisEncoderInstruction *, ZydisEncoderBuffer *)"
                 );
  }
  switch(local_f8->opcode_map) {
  case ZYDIS_OPCODE_MAP_DEFAULT:
    break;
  case ZYDIS_OPCODE_MAP_0F:
    uVar38 = local_100 + 1;
    goto LAB_00117dd2;
  case ZYDIS_OPCODE_MAP_0F38:
    uVar38 = local_100 + 1;
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf;
    local_100 = local_100 + 2;
    if (local_108 < local_100) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + uVar38) = 0x38;
    break;
  case ZYDIS_OPCODE_MAP_0F3A:
    uVar38 = local_100 + 1;
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf;
    local_100 = local_100 + 2;
    if (local_108 < local_100) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + uVar38) = 0x3a;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0xe44,
                  "ZyanStatus ZydisEmitInstruction(ZydisEncoderInstruction *, ZydisEncoderBuffer *)"
                 );
  case ZYDIS_OPCODE_MAP_0F0F:
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf;
    uVar38 = local_100 + 2;
    local_100 = local_100 + 1;
LAB_00117dd2:
    if (local_108 < uVar38) {
      return 0x80100009;
    }
    *(undefined1 *)((long)&definition->instruction_reference + local_100) = 0xf;
    local_100 = uVar38;
  }
  if (local_f8->encoding != ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(ZyanU8 *)((long)&definition->instruction_reference + local_100) = local_f8->opcode;
    local_100 = local_100 + 1;
  }
  uVar38 = local_f8->attributes;
  if ((uVar38 & 1) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + local_100) =
         local_f8->rm & 7 | (local_f8->reg & 7) << 3 | local_f8->mod << 6;
    uVar38 = local_f8->attributes;
    local_100 = local_100 + 1;
  }
  if ((uVar38 & 2) != 0) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(byte *)((long)&definition->instruction_reference + local_100) =
         local_f8->base & 7 | (local_f8->index & 7) << 3 | local_f8->scale << 6;
    local_100 = local_100 + 1;
  }
  if ((local_f8->disp_size != 0) &&
     (ZVar33 = ZydisEmitUInt(local_f8->disp,local_f8->disp_size >> 3,
                             (ZydisEncoderBuffer *)&definition), (int)ZVar33 < 0)) {
    return ZVar33;
  }
  if ((local_f8->imm_size != 0) &&
     (ZVar33 = ZydisEmitUInt(local_f8->imm,local_f8->imm_size >> 3,(ZydisEncoderBuffer *)&definition
                            ), (int)ZVar33 < 0)) {
    return ZVar33;
  }
  if (local_f8->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    if (local_108 < local_100 + 1) {
      return 0x80100009;
    }
    *(ZyanU8 *)((long)&definition->instruction_reference + local_100) = local_f8->opcode;
    local_100 = local_100 + 1;
  }
  *local_58 = local_100;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisEncoderEncodeInstructionInternal(const ZydisEncoderRequest *request,
    void *buffer, ZyanUSize *length, ZydisEncoderInstruction *instruction)
{
    ZydisEncoderInstructionMatch match;
    ZYAN_CHECK(ZydisFindMatchingDefinition(request, &match));
    ZydisEncoderBuffer output;
    output.buffer = (ZyanU8 *)buffer;
    output.size = *length;
    output.offset = 0;
    ZYAN_CHECK(ZydisBuildInstruction(&match, instruction));
    ZYAN_CHECK(ZydisEmitInstruction(instruction, &output));
    *length = output.offset;
    return ZYAN_STATUS_SUCCESS;
}